

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void * __thiscall
JetHead::File::mmap(File *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
                   __off_t __offset)

{
  size_t __len_00;
  uint8_t *local_28;
  uint8_t *addr;
  size_t length;
  int prot;
  File *this_local;
  
  length._4_4_ = 1;
  __len_00 = getLength(this);
  if ((this->mOpenFlags & 3U) == 3) {
    length._4_4_ = 3;
  }
  else if ((this->mOpenFlags & 2U) != 0) {
    length._4_4_ = 2;
  }
  local_28 = (uint8_t *)::mmap((void *)0x0,__len_00,length._4_4_,1,this->mFd,0);
  if (local_28 == (uint8_t *)0xffffffffffffffff) {
    setError(this);
    local_28 = (uint8_t *)0x0;
  }
  else {
    this->mMapAddress = local_28;
    this->mMapLength = __len_00;
  }
  return local_28;
}

Assistant:

uint8_t *File::mmap()
{
	int prot = PROT_READ;
	size_t length = getLength();

	if ( ( mOpenFlags & OF_RDWR ) == OF_RDWR )
		prot |= PROT_WRITE;
	else if ( mOpenFlags & OF_WRITE )
		prot = PROT_WRITE;

	uint8_t *addr = (uint8_t*)::mmap( NULL, length, prot, MAP_SHARED, mFd, 0 );

	if ( addr != MAP_FAILED )
	{
		mMapAddress = addr;
		mMapLength = length;
	}
	else
	{
		setError();
		addr = NULL;
	}

	return addr;
}